

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relation.cpp
# Opt level: O3

string * tuple_to_string(string *__return_storage_ptr__,
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *t)

{
  pointer pbVar1;
  ulong uVar2;
  long lVar3;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  pbVar1 = (t->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((t->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != pbVar1) {
    lVar3 = 0;
    uVar2 = 0;
    do {
      if (uVar2 != 0) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        pbVar1 = (pointer)((long)&(((t->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                          lVar3);
      }
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)(pbVar1->_M_dataplus)._M_p);
      uVar2 = uVar2 + 1;
      pbVar1 = (t->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar3 = lVar3 + 0x20;
    } while (uVar2 < (ulong)((long)(t->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5))
    ;
  }
  return __return_storage_ptr__;
}

Assistant:

string tuple_to_string(vector<string>& t)
{
 string res = "";
 for (size_t j = 0; j < t.size(); j++)
 {
  if (j)  res += " ";
  res += t[j];
 }
 return res;
}